

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O1

void __thiscall
mp::NLFeeder_Easy::NLFeeder_Easy(NLFeeder_Easy *this,NLModel *nls,NLW2_NLOptionsBasic_C opts)

{
  memcpy(this,nls,0xf8);
  std::
  _Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
  ::_Rb_tree((_Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
              *)&(this->nlme_).suffixes_,
             (_Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
              *)&nls->suffixes_);
  (this->nlopt_).n_text_mode_ = (int)opts._0_8_;
  (this->nlopt_).want_nl_comments_ = (int)((ulong)opts._0_8_ >> 0x20);
  (this->nlopt_).flags_ = opts.flags_;
  (this->nlv_obj_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->nlv_obj_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->nlv_obj_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->nlv_obj_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->obj_grad_supp_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->obj_grad_supp_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->nlv_obj_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->var_perm_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->var_perm_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->var_perm_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->var_perm_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->obj_grad_supp_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 4) = 0;
  memset(&(this->obj_grad_supp_).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage,0,200);
  (this->header_).super_NLInfo.super_NLInfo_C.format = 1;
  (this->header_).super_NLInfo.super_NLInfo_C.num_ampl_options = 3;
  (this->header_).super_NLInfo.super_NLInfo_C.prob_name = "nl_instance";
  (this->header_).super_NLInfo.super_NLInfo_C.ampl_vbtol = 0.0;
  (this->header_).super_NLInfo.super_NLInfo_C.arith_kind = 1;
  (this->header_).super_NLInfo.super_NLInfo_C.flags = 1;
  (this->header_).super_NLInfo.super_NLInfo_C.ampl_options[3] = 0;
  (this->header_).super_NLInfo.super_NLInfo_C.ampl_options[4] = 0;
  (this->header_).super_NLInfo.super_NLInfo_C.ampl_options[5] = 0;
  (this->header_).super_NLInfo.super_NLInfo_C.ampl_options[6] = 0;
  (this->header_).super_NLInfo.super_NLInfo_C.ampl_options[7] = 0;
  (this->header_).super_NLInfo.super_NLInfo_C.ampl_options[8] = 0;
  (this->header_).super_NLInfo.super_NLInfo_C.ampl_options[2] = 0;
  (this->header_).super_NLInfo.super_NLInfo_C.ampl_options[0] = 1;
  (this->header_).super_NLInfo.super_NLInfo_C.ampl_options[1] = 1;
  Init(this);
  return;
}

Assistant:

NLFeeder_Easy(const NLModel& nls, NLW2_NLOptionsBasic_C opts)
    : nlme_(nls), nlopt_(opts) { Init(); }